

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall ValueMapSymbol::restoreXml(ValueMapSymbol *this,Element *el,SleighBase *trans)

{
  Element *this_00;
  long lVar1;
  bool bVar2;
  _Ios_Fmtflags _Var3;
  reference ppEVar4;
  PatternExpression *pPVar5;
  string *psVar6;
  long local_200;
  intb val;
  allocator local_1e1;
  string local_1e0 [32];
  long local_1c0;
  istringstream s;
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_40;
  Element **local_38;
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_30;
  const_iterator iter;
  List *list;
  SleighBase *trans_local;
  Element *el_local;
  ValueMapSymbol *this_local;
  
  iter._M_current = (Element **)Element::getChildren(el);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  __normal_iterator(&local_30);
  local_38 = (Element **)std::vector<Element_*,_std::allocator<Element_*>_>::begin(iter._M_current);
  local_30._M_current = local_38;
  ppEVar4 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_30);
  pPVar5 = PatternExpression::restoreExpression(*ppEVar4,&trans->super_Translate);
  (this->super_ValueSymbol).patval = (PatternValue *)pPVar5;
  PatternExpression::layClaim(&((this->super_ValueSymbol).patval)->super_PatternExpression);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  operator++(&local_30);
  while( true ) {
    local_40._M_current =
         (Element **)std::vector<Element_*,_std::allocator<Element_*>_>::end(iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (!bVar2) break;
    ppEVar4 = __gnu_cxx::
              __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
              ::operator*(&local_30);
    this_00 = *ppEVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,"val",&local_1e1);
    psVar6 = Element::getAttributeValue(this_00,(string *)local_1e0);
    std::__cxx11::istringstream::istringstream((istringstream *)&local_1c0,psVar6,8);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    lVar1 = *(long *)(local_1c0 + -0x18);
    _Var3 = std::operator|(_S_dec,_S_hex);
    _Var3 = std::operator|(_Var3,_S_oct);
    std::ios_base::unsetf((ios_base *)((long)&local_1c0 + lVar1),_Var3);
    std::istream::operator>>(&local_1c0,&local_200);
    std::vector<long,_std::allocator<long>_>::push_back(&this->valuetable,&local_200);
    __gnu_cxx::
    __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    operator++(&local_30);
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1c0);
  }
  checkTableFill(this);
  return;
}

Assistant:

void ValueMapSymbol::restoreXml(const Element *el,SleighBase *trans)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  patval = (PatternValue *) PatternExpression::restoreExpression(*iter,trans);
  patval->layClaim();
  ++iter;
  while(iter != list.end()) {
    istringstream s((*iter)->getAttributeValue("val"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    intb val;
    s >> val;
    valuetable.push_back(val);
    ++iter;
  }
  checkTableFill();
}